

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void upb_MtDecoder_PushItem(upb_MtDecoder *d,upb_LayoutItem item)

{
  size_t sVar1;
  upb_LayoutItem *puVar2;
  undefined8 uVar3;
  size_t local_40;
  size_t new_cap;
  upb_MtDecoder *d_local;
  upb_LayoutItem item_local;
  
  uVar3 = item._0_8_;
  if ((d->vec).size == (d->vec).capacity) {
    if ((d->vec).size * 2 < 8) {
      local_40 = 8;
    }
    else {
      local_40 = (d->vec).size << 1;
    }
    puVar2 = (upb_LayoutItem *)realloc((d->vec).data,local_40 * 0xc);
    (d->vec).data = puVar2;
    upb_MdDecoder_CheckOutOfMemory(&d->base,(d->vec).data);
    (d->vec).capacity = local_40;
  }
  sVar1 = (d->vec).size;
  (d->vec).size = sVar1 + 1;
  puVar2 = (d->vec).data + sVar1;
  puVar2->field_index = (short)uVar3;
  puVar2->offset = (short)((ulong)uVar3 >> 0x10);
  puVar2->rep = (int)((ulong)uVar3 >> 0x20);
  puVar2->type = item.type;
  return;
}

Assistant:

static void upb_MtDecoder_PushItem(upb_MtDecoder* d, upb_LayoutItem item) {
  if (d->vec.size == d->vec.capacity) {
    size_t new_cap = UPB_MAX(8, d->vec.size * 2);
    d->vec.data = realloc(d->vec.data, new_cap * sizeof(*d->vec.data));
    upb_MdDecoder_CheckOutOfMemory(&d->base, d->vec.data);
    d->vec.capacity = new_cap;
  }
  d->vec.data[d->vec.size++] = item;
}